

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::ignore_case(string *item)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *this;
  string *in_stack_ffffffffffffffe8;
  
  this = in_RDI;
  ::std::__cxx11::string::string(in_RSI,in_stack_ffffffffffffffe8);
  detail::to_lower(in_stack_ffffffffffffffe8);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return in_RDI;
}

Assistant:

inline std::string ignore_case(std::string item) { return detail::to_lower(item); }